

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O2

void __thiscall JsrtRuntime::~JsrtRuntime(JsrtRuntime *this)

{
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,AllocationPolicyManager>
            (&Memory::HeapAllocator::Instance,this->allocationPolicyManager);
  if (this->jsrtDebugManager != (JsrtDebugManager *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebugManager>
              (&Memory::HeapAllocator::Instance,this->jsrtDebugManager);
    this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  }
  JsrtThreadService::~JsrtThreadService(&this->threadService);
  return;
}

Assistant:

JsrtRuntime::~JsrtRuntime()
{
    HeapDelete(allocationPolicyManager);
#ifdef ENABLE_SCRIPT_DEBUGGING
    if (this->jsrtDebugManager != nullptr)
    {
        HeapDelete(this->jsrtDebugManager);
        this->jsrtDebugManager = nullptr;
    }
#endif
}